

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportjson.cpp
# Opt level: O0

void __thiscall trun::ResultsReportJSON::PrintAssert(ResultsReportJSON *this,AssertErrorItem *aerr)

{
  char *pcVar1;
  string local_38;
  AssertErrorItem *local_18;
  AssertErrorItem *aerr_local;
  ResultsReportJSON *this_local;
  
  local_18 = aerr;
  aerr_local = (AssertErrorItem *)this;
  ResultsReportPinterBase::PushIndent(&this->super_ResultsReportPinterBase);
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&local_18->file);
  ResultsReportPinterBase::WriteLine
            (&this->super_ResultsReportPinterBase,"\"File\" : \"%s\",",pcVar1);
  ResultsReportPinterBase::WriteLine
            (&this->super_ResultsReportPinterBase,"\"Line\" : %d,",(ulong)(uint)local_18->line);
  EscapeString(&local_38,this,&local_18->message);
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&local_38);
  ResultsReportPinterBase::WriteLine
            (&this->super_ResultsReportPinterBase,"\"Message\" : \"%s\"",pcVar1);
  std::__cxx11::string::~string((string *)&local_38);
  ResultsReportPinterBase::PopIndent(&this->super_ResultsReportPinterBase);
  return;
}

Assistant:

void ResultsReportJSON::PrintAssert(const AssertError::AssertErrorItem &aerr) {
    PushIndent();
    WriteLine(R"("File" : "%s",)", aerr.file.c_str());
    WriteLine(R"("Line" : %d,)", aerr.line);
    WriteLine(R"("Message" : "%s")", EscapeString(aerr.message).c_str());
    PopIndent();
}